

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O0

void CProfileManager::dumpRecursive(CProfileIterator *profileIterator,int spacing)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int in_ESI;
  CProfileIterator *in_RDI;
  float fVar5;
  int i_1;
  float fraction;
  float current_total_time;
  int numChildren;
  float totalTime;
  int frames_since_reset;
  int i;
  float parent_time;
  float accumulated_time;
  float local_58;
  CProfileIterator *in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  CProfileIterator *in_stack_ffffffffffffffc0;
  float local_38;
  float local_34;
  int local_30;
  int local_24;
  uint local_18;
  float fVar6;
  
  CProfileIterator::First(in_stack_ffffffffffffffb0);
  bVar1 = CProfileIterator::Is_Done(in_RDI);
  if (!bVar1) {
    fVar6 = 0.0;
    bVar1 = CProfileIterator::Is_Root((CProfileIterator *)0x156caf);
    if (bVar1) {
      local_34 = Get_Time_Since_Reset();
    }
    else {
      local_34 = CProfileIterator::Get_Current_Parent_Total_Time((CProfileIterator *)0x156ccc);
    }
    iVar2 = Get_Frame_Count_Since_Reset();
    for (local_18 = 0; (int)local_18 < in_ESI; local_18 = local_18 + 1) {
      printf(".");
    }
    printf("----------------------------------\n");
    for (local_18 = 0; (int)local_18 < in_ESI; local_18 = local_18 + 1) {
      printf(".");
    }
    pcVar4 = CProfileIterator::Get_Current_Parent_Name((CProfileIterator *)0x156d59);
    printf("Profiling: %s (total running time: %.3f ms) ---\n",(double)local_34,pcVar4);
    local_24 = 0;
    local_18 = 0;
    while (bVar1 = CProfileIterator::Is_Done(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_24 = local_24 + 1;
      fVar5 = CProfileIterator::Get_Current_Total_Time((CProfileIterator *)0x156db7);
      fVar6 = fVar5 + fVar6;
      if (local_34 <= 1.1920929e-07) {
        local_38 = 0.0;
      }
      else {
        local_38 = (fVar5 / local_34) * 100.0;
      }
      for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
        printf(".");
      }
      in_stack_ffffffffffffffb0 =
           (CProfileIterator *)CProfileIterator::Get_Current_Name((CProfileIterator *)0x156e58);
      in_stack_ffffffffffffffb8 = (double)local_38;
      in_stack_ffffffffffffffc0 = (CProfileIterator *)((double)fVar5 / (double)iVar2);
      uVar3 = CProfileIterator::Get_Current_Total_Calls((CProfileIterator *)0x156e91);
      printf("%d -- %s (%.2f %%) :: %.3f ms / frame (%d calls)\n",in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffc0,(ulong)local_18,in_stack_ffffffffffffffb0,(ulong)uVar3);
      local_18 = local_18 + 1;
      CProfileIterator::Next(in_stack_ffffffffffffffb0);
    }
    for (local_18 = 0; (int)local_18 < in_ESI; local_18 = local_18 + 1) {
      printf(".");
    }
    if (local_34 <= 1.1920929e-07) {
      local_58 = 0.0;
    }
    else {
      local_58 = ((local_34 - fVar6) / local_34) * 100.0;
    }
    printf("%s (%.3f %%) :: %.3f ms\n",(double)local_58,(double)(local_34 - fVar6),"Unaccounted:");
    for (local_18 = 0; (int)local_18 < local_24; local_18 = local_18 + 1) {
      CProfileIterator::Enter_Child
                (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      dumpRecursive((CProfileIterator *)CONCAT44(in_ESI,fVar6),(int)local_34);
      CProfileIterator::Enter_Parent(in_stack_ffffffffffffffb0);
    }
  }
  return;
}

Assistant:

void	CProfileManager::dumpRecursive(CProfileIterator* profileIterator, int spacing)
{
	profileIterator->First();
	if (profileIterator->Is_Done())
		return;

	float accumulated_time=0,parent_time = profileIterator->Is_Root() ? CProfileManager::Get_Time_Since_Reset() : profileIterator->Get_Current_Parent_Total_Time();
	int i;
	int frames_since_reset = CProfileManager::Get_Frame_Count_Since_Reset();
	for (i=0;i<spacing;i++)	printf(".");
	printf("----------------------------------\n");
	for (i=0;i<spacing;i++)	printf(".");
	printf("Profiling: %s (total running time: %.3f ms) ---\n",	profileIterator->Get_Current_Parent_Name(), parent_time );
	float totalTime = 0.f;


	int numChildren = 0;

	for (i = 0; !profileIterator->Is_Done(); i++,profileIterator->Next())
	{
		numChildren++;
		float current_total_time = profileIterator->Get_Current_Total_Time();
		accumulated_time += current_total_time;
		float fraction = parent_time > SIMD_EPSILON ? (current_total_time / parent_time) * 100 : 0.f;
		{
			int i;	for (i=0;i<spacing;i++)	printf(".");
		}
		printf("%d -- %s (%.2f %%) :: %.3f ms / frame (%d calls)\n",i, profileIterator->Get_Current_Name(), fraction,(current_total_time / (double)frames_since_reset),profileIterator->Get_Current_Total_Calls());
		totalTime += current_total_time;
		//recurse into children
	}

	if (parent_time < accumulated_time)
	{
		//printf("what's wrong\n");
	}
	for (i=0;i<spacing;i++)	printf(".");
	printf("%s (%.3f %%) :: %.3f ms\n", "Unaccounted:",parent_time > SIMD_EPSILON ? ((parent_time - accumulated_time) / parent_time) * 100 : 0.f, parent_time - accumulated_time);

	for (i=0;i<numChildren;i++)
	{
		profileIterator->Enter_Child(i);
		dumpRecursive(profileIterator,spacing+3);
		profileIterator->Enter_Parent();
	}
}